

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t skip_mode_rd(RD_STATS *rd_stats,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,
                    BUFFER_SET *orig_dst,int64_t best_rd)

{
  undefined4 uVar1;
  BUFFER_SET dst;
  int num_planes_00;
  int iVar2;
  int iVar3;
  AV1_COMMON *cm_00;
  MACROBLOCKD *xd_00;
  BLOCK_SIZE in_CL;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  undefined1 (*in_R8) [12];
  uint *in_R9;
  int64_t sse;
  BLOCK_SIZE plane_bsize;
  macroblockd_plane *pd;
  int plane;
  int skip_mode_ctx;
  int64_t this_rd;
  int64_t total_sse;
  int mi_col;
  int mi_row;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  long local_80;
  macroblockd_plane *in_stack_ffffffffffffff90;
  int plane_00;
  MACROBLOCK *x_00;
  MACROBLOCKD *xd_01;
  undefined2 uVar4;
  BLOCK_SIZE tx_bsize;
  BLOCK_SIZE plane_bsize_00;
  int blk_col;
  int in_stack_ffffffffffffffc0;
  
  cm_00 = (AV1_COMMON *)(in_RSI + 0x3bf80);
  num_planes_00 = av1_num_planes(cm_00);
  xd_00 = (MACROBLOCKD *)(in_RDX + 0x1a0);
  blk_col = xd_00->mi_row;
  uVar1 = *(undefined4 *)(in_RDX + 0x1a4);
  uVar4 = (undefined2)uVar1;
  tx_bsize = (BLOCK_SIZE)((uint)uVar1 >> 0x10);
  plane_bsize_00 = (BLOCK_SIZE)((uint)uVar1 >> 0x18);
  xd_01 = (MACROBLOCKD *)0x0;
  x_00 = (MACROBLOCK *)0x7fffffffffffffff;
  iVar2 = av1_get_skip_mode_context(xd_00);
  *in_RDI = *(int *)(in_RDX + 0x7ed4 + (long)iVar2 * 8);
  for (plane_00 = 0; plane_00 < num_planes_00; plane_00 = plane_00 + 1) {
    av1_enc_build_inter_predictor
              ((AV1_COMMON *)CONCAT44(blk_col,CONCAT13(plane_bsize_00,CONCAT12(tx_bsize,uVar4))),
               xd_01,(int)((ulong)x_00 >> 0x20),(int)x_00,(BUFFER_SET *)CONCAT44(iVar2,plane_00),
               (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff90 >> 0x38),in_stack_ffffffffffffffc0,
               (int)cm_00);
    in_stack_ffffffffffffff90 = xd_00->plane + plane_00;
    get_plane_block_size
              (in_CL,in_stack_ffffffffffffff90->subsampling_x,
               in_stack_ffffffffffffff90->subsampling_y);
    av1_subtract_plane(x_00,(BLOCK_SIZE)((uint)iVar2 >> 0x18),plane_00);
    local_80 = av1_pixel_diff_dist((MACROBLOCK *)CONCAT44(num_planes_00,in_stack_ffffffffffffffc0),
                                   (int)((ulong)xd_00 >> 0x20),(int)xd_00,blk_col,plane_bsize_00,
                                   tx_bsize,in_R9);
    iVar3 = is_cur_buf_hbd(xd_00);
    if (iVar3 != 0) {
      local_80 = local_80 + ((1 << (((char)xd_00->bd + -8) * '\x02' & 0x1fU)) >> 1) >>
                 (((char)xd_00->bd + -8) * '\x02' & 0x3fU);
    }
    xd_01 = (MACROBLOCKD *)((long)(xd_01->plane[0].pre + -2) + local_80 * 0x10);
    x_00 = (MACROBLOCK *)
           (((long)*in_RDI * (long)*(int *)(in_RDX + 0x4218) + 0x100 >> 9) + (long)xd_01 * 0x80);
    if ((long)in_R9 < (long)x_00) break;
  }
  *(MACROBLOCKD **)(in_RDI + 6) = xd_01;
  *(MACROBLOCKD **)(in_RDI + 2) = xd_01;
  *(MACROBLOCK **)(in_RDI + 4) = x_00;
  dst.plane[1]._4_4_ = (int)((ulong)*(undefined8 *)(*in_R8 + 8) >> 0x20);
  dst.plane._0_12_ = *in_R8;
  dst.plane[2] = (uint8_t *)*(undefined8 *)(in_R8[1] + 4);
  dst.stride._0_8_ = *(undefined8 *)in_R8[2];
  dst._32_8_ = *(undefined8 *)(in_R8[2] + 8);
  restore_dst_buf(xd_00,dst,num_planes_00);
  return 0;
}

Assistant:

static int64_t skip_mode_rd(RD_STATS *rd_stats, const AV1_COMP *const cpi,
                            MACROBLOCK *const x, BLOCK_SIZE bsize,
                            const BUFFER_SET *const orig_dst, int64_t best_rd) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int64_t total_sse = 0;
  int64_t this_rd = INT64_MAX;
  const int skip_mode_ctx = av1_get_skip_mode_context(xd);
  rd_stats->rate = x->mode_costs.skip_mode_cost[skip_mode_ctx][1];

  for (int plane = 0; plane < num_planes; ++plane) {
    // Call av1_enc_build_inter_predictor() for one plane at a time.
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  plane, plane);
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

    av1_subtract_plane(x, plane_bsize, plane);

    int64_t sse =
        av1_pixel_diff_dist(x, plane, 0, 0, plane_bsize, plane_bsize, NULL);
    if (is_cur_buf_hbd(xd)) sse = ROUND_POWER_OF_TWO(sse, (xd->bd - 8) * 2);
    sse <<= 4;
    total_sse += sse;
    // When current rd cost is more than the best rd, skip evaluation of
    // remaining planes.
    this_rd = RDCOST(x->rdmult, rd_stats->rate, total_sse);
    if (this_rd > best_rd) break;
  }

  rd_stats->dist = rd_stats->sse = total_sse;
  rd_stats->rdcost = this_rd;

  restore_dst_buf(xd, *orig_dst, num_planes);
  return 0;
}